

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O2

int __thiscall
chrono::collision::BoxBoxCollisionTest2::RectQuadEdgeIntersectionTest::operator()
          (RectQuadEdgeIntersectionTest *this,double *envelope,double *rect,double *quad,
          bool *inside,double *ret)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  bool *pbVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double qyt_1;
  double qyt;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double qxt_1;
  double dVar22;
  double qxt;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  
  iVar5 = 0;
  pdVar7 = quad;
  lVar8 = 0;
  do {
    lVar6 = 0;
    pbVar10 = inside;
    do {
      pdVar9 = pdVar7;
      pdVar7 = pdVar9 + 2;
      lVar1 = lVar8 + lVar6;
      if (lVar1 == 4) {
        return iVar5;
      }
      lVar2 = lVar8 + 1 + lVar6;
      if (pbVar10[lVar8] != true) break;
      lVar6 = lVar6 + 1;
      pbVar10 = pbVar10 + 1;
    } while (inside[(uint)lVar2 & 3] != false);
    dVar16 = *pdVar9;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar16;
    dVar14 = pdVar9[1];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar14;
    pdVar9 = pdVar7;
    if (lVar1 == 3) {
      pdVar9 = quad;
    }
    dVar17 = *pdVar9;
    dVar3 = pdVar9[1];
    dVar19 = dVar17 - dVar16;
    dVar4 = dVar3 - dVar14;
    if ((dVar19 != 0.0) || (NAN(dVar19))) {
      dVar22 = *rect;
      auVar18._0_8_ = dVar4 / dVar19;
      auVar18._8_8_ = 0;
      dVar23 = -dVar22;
      if (((dVar16 < dVar23) && (dVar23 < dVar17)) || ((dVar23 < dVar16 && (dVar17 < dVar23)))) {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar23 - dVar16;
        auVar25 = vfmadd213sd_fma(auVar25,auVar18,auVar12);
        dVar24 = auVar25._0_8_;
        if ((-rect[1] < dVar24) && (dVar24 < rect[1])) {
          *ret = dVar23;
          ret[1] = dVar24;
          ret = ret + 2;
          iVar5 = iVar5 + 1;
          dVar22 = *rect;
        }
      }
      if (((dVar16 < dVar22) && (dVar22 < dVar17)) || ((dVar22 < dVar16 && (dVar17 < dVar22)))) {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar22 - dVar16;
        auVar12 = vfmadd213sd_fma(auVar18,auVar20,auVar12);
        dVar16 = auVar12._0_8_;
        if ((-rect[1] < dVar16) && (dVar16 < rect[1])) {
          *ret = dVar22;
          ret[1] = dVar16;
          ret = ret + 2;
          iVar5 = iVar5 + 1;
        }
      }
    }
    lVar8 = lVar2;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      auVar15._0_8_ = dVar19 / dVar4;
      auVar15._8_8_ = 0;
      dVar16 = rect[1];
      dVar17 = -dVar16;
      if (((dVar14 < dVar17) && (dVar17 < dVar3)) || ((dVar17 < dVar14 && (dVar3 < dVar17)))) {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar17 - dVar14;
        auVar12 = vfmadd213sd_fma(auVar21,auVar15,auVar11);
        dVar19 = auVar12._0_8_;
        if ((-*rect < dVar19) && (dVar19 < *rect)) {
          *ret = dVar19;
          ret[1] = dVar17;
          ret = ret + 2;
          iVar5 = iVar5 + 1;
          dVar16 = rect[1];
        }
      }
      if (((dVar14 < dVar16) && (dVar16 < dVar3)) || ((dVar16 < dVar14 && (dVar3 < dVar16)))) {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar16 - dVar14;
        auVar11 = vfmadd213sd_fma(auVar15,auVar13,auVar11);
        dVar14 = auVar11._0_8_;
        if ((-*rect < dVar14) && (dVar14 < *rect)) {
          *ret = dVar14;
          ret[1] = dVar16;
          ret = ret + 2;
          iVar5 = iVar5 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

int operator()(double const& envelope, double* rect, double* quad, bool* inside, double* ret) {
            int cnt = 0;
            double* r = ret;
            {
                //--- Test the four edges of the quad for crossing the edges of the rect.
                double qx0, qy0, qx1, qy1, tst;
                double* q = quad;
                for (int i = 0; i < 4; ++i) {
                    qx0 = *q;
                    ++q;
                    qy0 = *q;
                    ++q;
                    double* nextq = (i == 3) ? quad : q;
                    qx1 = *nextq;
                    ++nextq;
                    qy1 = *nextq;
                    bool inside0 = inside[i];
                    bool inside1 = inside[(i + 1) % 4];
                    if (inside0 && inside1)
                        continue;
                    double dx = (qx1 - qx0);
                    double dy = (qy1 - qy0);
                    if (dx) {
                        double alpha = dy / dx;
                        tst = -rect[0];  //--- left side
                        if (((qx0 < tst) && (qx1 > tst)) || ((qx0 > tst) && (qx1 < tst))) {
                            double qxt = -rect[0];
                            double qyt = qy0 + (qxt - qx0) * alpha;
                            if ((-rect[1] < qyt) && (qyt < rect[1])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                        tst = rect[0];
                        if (((qx0 < tst) && (qx1 > tst)) || ((qx0 > tst) && (qx1 < tst))) {
                            double qxt = rect[0];
                            double qyt = qy0 + (qxt - qx0) * alpha;
                            if ((-rect[1] < qyt) && (qyt < rect[1])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                    }
                    if (dy) {
                        double inv_alpha = dx / dy;
                        tst = -rect[1];  //--- bottom side
                        if (((qy0 < tst) && (qy1 > tst)) || ((qy0 > tst) && (qy1 < tst))) {
                            double qyt = -rect[1];
                            double qxt = qx0 + (qyt - qy0) * inv_alpha;
                            if ((-rect[0] < qxt) && (qxt < rect[0])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                        tst = rect[1];  //--- top side
                        if (((qy0 < tst) && (qy1 > tst)) || ((qy0 > tst) && (qy1 < tst))) {
                            double qyt = rect[1];
                            double qxt = qx0 + (qyt - qy0) * inv_alpha;
                            if ((-rect[0] < qxt) && (qxt < rect[0])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                    }
                }
            }
            return cnt;
        }